

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_moveAssignmentEmptyForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
::~optTyped_moveAssignmentEmptyForEmpty_Test
          (optTyped_moveAssignmentEmptyForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
           *this)

{
  optTyped_moveAssignmentEmptyForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
  *this_local;
  
  ~optTyped_moveAssignmentEmptyForEmpty_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TYPED_TEST(optTyped, moveAssignmentEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1;
  opt_type o2;
  o2 = std::move(o1);
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}